

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

char * google::protobuf::internal::PackedEnumParserArg
                 (void *object,char *ptr,ParseContext *ctx,_func_bool_void_ptr_int *is_valid,
                 void *data,InternalMetadataWithArena *metadata,int field_num)

{
  char *pcVar1;
  uint64 value;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  UnknownFieldSet *this;
  int iVar5;
  char *local_58;
  int local_50;
  int local_4c;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *local_48;
  RepeatedField<int> *local_40;
  uint64 local_38;
  
  local_58 = ptr;
  local_48 = &metadata->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ;
  local_40 = (RepeatedField<int> *)object;
  uVar3 = ReadSize(&local_58);
  if (local_58 != (char *)0x0) {
    pcVar1 = (ctx->super_EpsCopyInputStream).buffer_end_;
    uVar4 = uVar3 + ((int)local_58 - (int)pcVar1);
    (ctx->super_EpsCopyInputStream).limit_end_ = pcVar1 + (int)((int)uVar4 >> 0x1f & uVar4);
    local_50 = (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar4;
    local_50 = local_50 - uVar4;
    if (-1 < local_50) {
      while (bVar2 = EpsCopyInputStream::DoneWithCheck(&ctx->super_EpsCopyInputStream,&local_58,-1),
            !bVar2) {
        local_58 = VarintParse<unsigned_long>(local_58,&local_38);
        value = local_38;
        if (local_58 == (char *)0x0) {
          return (char *)0x0;
        }
        iVar5 = (int)local_38;
        bVar2 = (*is_valid)(data,iVar5);
        if (bVar2) {
          local_4c = iVar5;
          RepeatedField<int>::Add(local_40,&local_4c);
        }
        else {
          if (((ulong)local_48->ptr_ & 1) == 0) {
            this = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ::mutable_unknown_fields_slow(local_48);
          }
          else {
            this = (UnknownFieldSet *)((ulong)local_48->ptr_ & 0xfffffffffffffffe);
          }
          UnknownFieldSet::AddVarint(this,field_num,value);
        }
      }
      bVar2 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,local_50);
      if (bVar2) {
        return local_58;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* PackedEnumParserArg(void* object, const char* ptr,
                                ParseContext* ctx,
                                bool (*is_valid)(const void*, int),
                                const void* data,
                                InternalMetadataWithArena* metadata,
                                int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, data, metadata, field_num](uint64 val) {
        if (is_valid(data, val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields());
        }
      });
}